

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O3

bool __thiscall
google::protobuf::compiler::Parser::ParseMessageDefinition
          (Parser *this,DescriptorProto *message,LocationRecorder *message_location,
          FileDescriptorProto *containing_file)

{
  ArenaStringPtr *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  size_type sVar1;
  char *pcVar2;
  ErrorCollector *pEVar3;
  bool bVar4;
  string *output;
  long *plVar5;
  long *plVar6;
  Arena *arena;
  size_type sVar7;
  LocationRecorder location;
  long *local_80;
  long local_78;
  long local_70;
  undefined4 uStack_68;
  undefined4 uStack_64;
  LocationRecorder local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  bVar4 = Consume(this,"message");
  if (bVar4) {
    LocationRecorder::Init(&local_60,message_location,message_location->source_code_info_);
    LocationRecorder::AddPath(&local_60,1);
    LocationRecorder::RecordLegacyLocation(&local_60,&message->super_Message,NAME);
    *(byte *)(message->_has_bits_).has_bits_ = (byte)(message->_has_bits_).has_bits_[0] | 1;
    this_00 = &message->name_;
    arena = (Arena *)(message->_internal_metadata_).
                     super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                     .ptr_;
    if (((ulong)arena & 1) != 0) {
      arena = *(Arena **)(((ulong)arena & 0xfffffffffffffffe) + 0x18);
    }
    output = this_00->ptr_;
    if (output == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
      internal::ArenaStringPtr::CreateInstance
                (this_00,arena,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
      output = this_00->ptr_;
    }
    bVar4 = ConsumeIdentifier(this,output,"Expected message name.");
    if (bVar4) {
      __rhs = this_00->ptr_;
      sVar1 = __rhs->_M_string_length;
      if (sVar1 != 0) {
        pcVar2 = (__rhs->_M_dataplus)._M_p;
        if ((byte)(*pcVar2 + 0xbfU) < 0x1a) {
          if (sVar1 != 1) {
            sVar7 = 1;
            do {
              if (pcVar2[sVar7] == '_') goto LAB_00310941;
              sVar7 = sVar7 + 1;
            } while (sVar1 != sVar7);
          }
        }
        else {
LAB_00310941:
          std::operator+(&local_48,"Message name should be in UpperCamelCase. Found: ",__rhs);
          plVar5 = (long *)std::__cxx11::string::append((char *)&local_48);
          plVar6 = plVar5 + 2;
          if ((long *)*plVar5 == plVar6) {
            local_70 = *plVar6;
            uStack_68 = (undefined4)plVar5[3];
            uStack_64 = *(undefined4 *)((long)plVar5 + 0x1c);
            local_80 = &local_70;
          }
          else {
            local_70 = *plVar6;
            local_80 = (long *)*plVar5;
          }
          local_78 = plVar5[1];
          *plVar5 = (long)plVar6;
          plVar5[1] = 0;
          *(undefined1 *)(plVar5 + 2) = 0;
          pEVar3 = this->error_collector_;
          if (pEVar3 != (ErrorCollector *)0x0) {
            (*pEVar3->_vptr_ErrorCollector[3])
                      (pEVar3,(ulong)(uint)(this->input_->current_).line,
                       (ulong)(uint)(this->input_->current_).column,&local_80);
          }
          if (local_80 != &local_70) {
            operator_delete(local_80);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_48._M_dataplus._M_p != &local_48.field_2) {
            operator_delete(local_48._M_dataplus._M_p);
          }
        }
      }
      LocationRecorder::~LocationRecorder(&local_60);
      bVar4 = ParseMessageBlock(this,message,message_location,containing_file);
      return bVar4;
    }
    LocationRecorder::~LocationRecorder(&local_60);
  }
  return false;
}

Assistant:

bool Parser::ParseMessageDefinition(
    DescriptorProto* message, const LocationRecorder& message_location,
    const FileDescriptorProto* containing_file) {
  DO(Consume("message"));
  {
    LocationRecorder location(message_location,
                              DescriptorProto::kNameFieldNumber);
    location.RecordLegacyLocation(message,
                                  DescriptorPool::ErrorCollector::NAME);
    DO(ConsumeIdentifier(message->mutable_name(), "Expected message name."));
    if (!IsUpperCamelCase(message->name())) {
      AddWarning(
          "Message name should be in UpperCamelCase. Found: " +
          message->name() +
          ". See https://developers.google.com/protocol-buffers/docs/style");
    }
  }
  DO(ParseMessageBlock(message, message_location, containing_file));
  return true;
}